

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

void Llb_CoreStop(Llb_Img_t *p)

{
  DdManager *table;
  void **__ptr;
  DdNode *n;
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  if ((p->vDdMans != (Vec_Ptr_t *)0x0) && (pVVar2 = p->vDdMans, 0 < pVVar2->nSize)) {
    lVar3 = 0;
    do {
      table = (DdManager *)pVVar2->pArray[lVar3];
      if (table->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc);
      }
      if (table->bFunc2 != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc2);
      }
      Extra_StopManager(table);
      lVar3 = lVar3 + 1;
      pVVar2 = p->vDdMans;
    } while (lVar3 < pVVar2->nSize);
  }
  if (p->vDdMans != (Vec_Ptr_t *)0x0) {
    __ptr = p->vDdMans->pArray;
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->vDdMans->pArray = (void **)0x0;
    }
    if (p->vDdMans != (Vec_Ptr_t *)0x0) {
      free(p->vDdMans);
      p->vDdMans = (Vec_Ptr_t *)0x0;
    }
  }
  n = p->ddR->bFunc;
  if (n != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,n);
  }
  pVVar2 = p->vRings;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(p->ddR,(DdNode *)pVVar2->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar2 = p->vRings;
    } while (lVar3 < pVVar2->nSize);
  }
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  Extra_StopManager(p->dd);
  Extra_StopManager(p->ddG);
  Extra_StopManager(p->ddR);
  if (p->vDriRefs != (Vec_Int_t *)0x0) {
    piVar1 = p->vDriRefs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vDriRefs->pArray = (int *)0x0;
    }
    if (p->vDriRefs != (Vec_Int_t *)0x0) {
      free(p->vDriRefs);
      p->vDriRefs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vVarsCs != (Vec_Int_t *)0x0) {
    piVar1 = p->vVarsCs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vVarsCs->pArray = (int *)0x0;
    }
    if (p->vVarsCs != (Vec_Int_t *)0x0) {
      free(p->vVarsCs);
      p->vVarsCs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vVarsNs != (Vec_Int_t *)0x0) {
    piVar1 = p->vVarsNs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vVarsNs->pArray = (int *)0x0;
    }
    if (p->vVarsNs != (Vec_Int_t *)0x0) {
      free(p->vVarsNs);
      p->vVarsNs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCs2Glo != (Vec_Int_t *)0x0) {
    piVar1 = p->vCs2Glo->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vCs2Glo->pArray = (int *)0x0;
    }
    if (p->vCs2Glo != (Vec_Int_t *)0x0) {
      free(p->vCs2Glo);
      p->vCs2Glo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vNs2Glo != (Vec_Int_t *)0x0) {
    piVar1 = p->vNs2Glo->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vNs2Glo->pArray = (int *)0x0;
    }
    if (p->vNs2Glo != (Vec_Int_t *)0x0) {
      free(p->vNs2Glo);
      p->vNs2Glo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
    piVar1 = p->vGlo2Cs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vGlo2Cs->pArray = (int *)0x0;
    }
    if (p->vGlo2Cs != (Vec_Int_t *)0x0) {
      free(p->vGlo2Cs);
      p->vGlo2Cs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
    piVar1 = p->vGlo2Ns->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vGlo2Ns->pArray = (int *)0x0;
    }
    if (p->vGlo2Ns != (Vec_Int_t *)0x0) {
      free(p->vGlo2Ns);
      p->vGlo2Ns = (Vec_Int_t *)0x0;
    }
  }
  if (p != (Llb_Img_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Llb_CoreStop( Llb_Img_t * p )
{
    DdManager * dd;
    DdNode * bTemp;
    int i;
    if ( p->vDdMans )
    Vec_PtrForEachEntry( DdManager *, p->vDdMans, dd, i )
    {
        if ( dd->bFunc )
            Cudd_RecursiveDeref( dd, dd->bFunc );
        if ( dd->bFunc2 )
            Cudd_RecursiveDeref( dd, dd->bFunc2 );
        Extra_StopManager( dd );
    }
    Vec_PtrFreeP( &p->vDdMans );
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    Extra_StopManager( p->dd );
    Extra_StopManager( p->ddG );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vDriRefs );
    Vec_IntFreeP( &p->vVarsCs );
    Vec_IntFreeP( &p->vVarsNs );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    ABC_FREE( p );
}